

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirSAVETAP(void)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 in_RCX;
  EStatus EVar8;
  uint uVar9;
  uint start;
  char *pcVar10;
  char *pcVar11;
  uint length;
  uint param2;
  uint param3;
  aint val;
  char *id;
  string fnaamh;
  path fnaam;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  undefined4 local_a4;
  char *local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  string local_78;
  path local_58;
  
  pcVar1 = DeviceID;
  if (pass != 3) {
    SkipParam(&lp);
    return;
  }
  if (DeviceID == (char *)0x0) {
    Error("SAVETAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  GetOutputFileName_abi_cxx11_(&local_58,&lp);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  bVar2 = anyComma(&lp);
  if (bVar2) {
    bVar2 = anyComma(&lp);
    pcVar11 = lp;
    if (bVar2) {
LAB_0010eeb9:
      Error("[SAVETAP] Syntax error. No parameters",bp,PASS3);
      goto LAB_0010f2aa;
    }
    local_a0 = GetID(&lp);
    local_a4 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),0xff);
    if ((local_a0 == (char *)0x0) || (*local_a0 == '\0')) {
      local_ac = 0;
      bVar2 = false;
    }
    else {
      iVar5 = cmphstr(&local_a0,"basic",false);
      if (iVar5 == 0) {
        iVar5 = cmphstr(&local_a0,"numbers",false);
        if (iVar5 == 0) {
          iVar5 = cmphstr(&local_a0,"chars",false);
          if (iVar5 == 0) {
            iVar5 = cmphstr(&local_a0,"code",false);
            if (iVar5 == 0) {
              iVar5 = cmphstr(&local_a0,"headless",false);
              bVar2 = iVar5 != 0;
              local_ac = CONCAT31((int3)((uint)iVar5 >> 8),bVar2);
              goto LAB_0010eedd;
            }
            uVar7 = CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),3);
          }
          else {
            uVar7 = CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),2);
          }
          local_a4 = (undefined4)uVar7;
        }
        else {
          uVar7 = CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1);
          local_a4 = (undefined4)uVar7;
        }
        bVar2 = false;
        local_ac = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        local_ac = (uint)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1);
        bVar2 = false;
        local_a4 = 0;
      }
    }
LAB_0010eedd:
    uVar9 = 0xffffffff;
    if ((char)local_ac == '\0') {
      length = 0xffffffff;
      uVar6 = local_ac;
      param2 = 0xffffffff;
      param3 = 0xffffffff;
LAB_0010ef55:
      start = uVar9;
      bVar2 = true;
      if ((char)uVar6 == '\0') {
        IsLabelNotFound = false;
        lp = pcVar11;
        local_ac = length;
        local_a8 = param2;
        iVar5 = ParseExpression(&lp,(aint *)&local_b0);
        pcVar11 = "[SAVETAP] Syntax error";
        if ((iVar5 != 0) && (IsLabelNotFound == false)) {
          start = local_b0;
          param2 = local_a8;
          length = local_ac;
          bVar2 = true;
          if (-1 < (int)local_b0) goto LAB_0010f210;
          pcVar11 = "[SAVETAP] Negative values are not allowed";
        }
        Error(pcVar11,bp,PASS3);
        start = uVar9;
        param2 = local_a8;
        length = local_ac;
        bVar2 = false;
      }
    }
    else {
      bVar3 = anyComma(&lp);
      if (!bVar3) {
        length = 0xffffffff;
        uVar6 = 0;
        param2 = 0xffffffff;
        param3 = 0xffffffff;
        goto LAB_0010ef55;
      }
      if (bVar2) {
        bVar2 = anyComma(&lp);
        if (bVar2) {
          pcVar10 = "[SAVETAP] Syntax error. Missing start address";
          goto LAB_0010f1db;
        }
        iVar5 = ParseExpression(&lp,(aint *)&local_b0);
        uVar9 = local_b0;
        if (iVar5 == 0) {
          pcVar10 = "[SAVETAP] Syntax error";
          goto LAB_0010f1db;
        }
        if ((int)local_b0 < 0) {
LAB_0010f1d4:
          pcVar10 = "[SAVETAP] Negative values are not allowed";
          goto LAB_0010f1db;
        }
        if (0xffff < (int)local_b0) {
LAB_0010f02d:
          pcVar10 = "[SAVETAP] Values higher than FFFFh are not allowed";
          goto LAB_0010f1db;
        }
        bVar2 = anyComma(&lp);
        length = 0xffffffff;
        if (bVar2) {
          iVar5 = ParseExpression(&lp,(aint *)&local_b0);
          if (iVar5 == 0) {
            pcVar11 = "[SAVETAP] Syntax error";
          }
          else if ((int)local_b0 < 0) {
            pcVar11 = "[SAVETAP] Negative values are not allowed";
          }
          else {
            length = local_b0;
            if ((int)local_b0 < 0x10000) goto LAB_0010f34b;
            pcVar11 = "[SAVETAP] Values higher than FFFFh are not allowed";
          }
          Error(pcVar11,bp,PASS3);
          goto LAB_0010f200;
        }
LAB_0010f34b:
        bVar2 = anyComma(&lp);
        if (!bVar2) {
          param3 = 0xffffffff;
LAB_0010f3f1:
          uVar6 = local_ac;
          param2 = 0xffffffff;
          goto LAB_0010ef55;
        }
        iVar5 = ParseExpression(&lp,(aint *)&local_b0);
        if (iVar5 == 0) {
          pcVar11 = "[SAVETAP] Syntax error";
        }
        else {
          param3 = local_b0;
          if (local_b0 < 0x100) goto LAB_0010f3f1;
          pcVar11 = "[SAVETAP] Invalid flag byte";
        }
        Error(pcVar11,bp,PASS3);
LAB_0010f3d3:
        param3 = 0xffffffff;
        start = uVar9;
        uVar6 = local_ac;
        param2 = 0xffffffff;
        bVar2 = false;
      }
      else {
        bVar2 = anyComma(&lp);
        if (bVar2) {
          pcVar10 = "[SAVETAP] Syntax error. Missing tape block file name";
LAB_0010f1db:
          Error(pcVar10,bp,PASS3);
          uVar9 = 0xffffffff;
        }
        else {
          GetDelimitedString_abi_cxx11_(&local_78,&lp);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (local_90 == 0) {
            pcVar10 = "[SAVETAP] Syntax error in tape file name";
            goto LAB_0010f1db;
          }
          bVar2 = anyComma(&lp);
          pcVar10 = "[SAVETAP] Syntax error. Missing start address";
          if (((!bVar2) || (bVar2 = anyComma(&lp), bVar2)) ||
             (iVar5 = ParseExpression(&lp,(aint *)&local_b0), uVar9 = local_b0, iVar5 == 0))
          goto LAB_0010f1db;
          if ((int)local_b0 < 0) goto LAB_0010f1d4;
          if (0xffff < (int)local_b0) goto LAB_0010f02d;
          bVar2 = anyComma(&lp);
          pcVar10 = "[SAVETAP] Syntax error. Missing block length";
          if (((bVar2) && (bVar2 = anyComma(&lp), !bVar2)) &&
             (iVar5 = ParseExpression(&lp,(aint *)&local_b0), length = local_b0, iVar5 != 0)) {
            if ((int)local_b0 < 0) {
              pcVar10 = "[SAVETAP] Negative values are not allowed";
            }
            else {
              if ((int)local_b0 < 0x10000) {
                bVar2 = anyComma(&lp);
                local_a8 = 0xffffffff;
                if (bVar2) {
                  iVar5 = ParseExpression(&lp,(aint *)&local_b0);
                  if (iVar5 == 0) {
                    EVar8 = IF_FIRST;
                    pcVar11 = "[SAVETAP] Syntax error";
                  }
                  else {
                    EVar8 = PASS3;
                    local_a8 = local_b0;
                    if ((int)local_b0 < 0) {
                      pcVar11 = "[SAVETAP] Negative values are not allowed";
                    }
                    else {
                      if ((int)local_b0 < 0x10000) goto LAB_0010f487;
                      pcVar11 = "[SAVETAP] Values more than FFFFh are not allowed";
                    }
                  }
                  Error(pcVar11,bp,EVar8);
                  goto LAB_0010f3d3;
                }
LAB_0010f487:
                bVar2 = anyComma(&lp);
                uVar6 = local_ac;
                param2 = local_a8;
                param3 = 0xffffffff;
                if (!bVar2) goto LAB_0010ef55;
                iVar5 = ParseExpression(&lp,(aint *)&local_b0);
                if (iVar5 == 0) {
                  EVar8 = IF_FIRST;
                  pcVar11 = "[SAVETAP] Syntax error";
                }
                else {
                  EVar8 = PASS3;
                  if ((int)local_b0 < 0) {
                    pcVar11 = "[SAVETAP] Negative values are not allowed";
                  }
                  else {
                    uVar6 = local_ac;
                    param2 = local_a8;
                    param3 = local_b0;
                    if ((int)local_b0 < 0x10000) goto LAB_0010ef55;
                    pcVar11 = "[SAVETAP] Values more than FFFFh are not allowed";
                  }
                }
                Error(pcVar11,bp,EVar8);
                param3 = 0xffffffff;
                start = uVar9;
                uVar6 = local_ac;
                param2 = local_a8;
                bVar2 = false;
                goto LAB_0010f210;
              }
              pcVar10 = "[SAVETAP] Values higher than FFFFh are not allowed";
            }
          }
          Error(pcVar10,bp,PASS3);
        }
LAB_0010f200:
        param3 = 0xffffffff;
        start = uVar9;
        uVar6 = local_ac;
        param2 = 0xffffffff;
        length = 0xffffffff;
        bVar2 = false;
      }
    }
LAB_0010f210:
    cVar4 = (char)uVar6;
    if (!bVar2) goto LAB_0010f2aa;
  }
  else {
    if (StartAddress < 0) goto LAB_0010eeb9;
    length = 0xffffffff;
    local_a4 = 0x1896ff;
    cVar4 = '\0';
    param2 = 0xffffffff;
    param3 = 0xffffffff;
    start = StartAddress;
  }
  if (pcVar1 != (char *)0x0) {
    if (cVar4 == '\0') {
      bVar2 = IsZXSpectrumDevice(DeviceID);
      if (bVar2) {
        iVar5 = TAP_SaveSnapshot(&local_58,(unsigned_short)start);
      }
      else {
        iVar5 = 0;
        Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.",Device->ID,SUPPRESS);
      }
    }
    else {
      iVar5 = TAP_SaveBlock(&local_58,(uchar)local_a4,(char *)local_98,start,length,param2,param3);
    }
    if (iVar5 == 0) {
      Error("[SAVETAP] Error writing file",bp,IF_FIRST);
    }
  }
LAB_0010f2aa:
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

static void dirSAVETAP() {
	if (pass != LASTPASS) {
		SkipParam(lp);
		return;
	}

	bool exec = true, realtapeMode = false;
	int headerType = -1;
	aint val;
	int start = -1, length = -1, param2 = -1, param3 = -1;

	if (!DeviceID) {
		Error("SAVETAP only allowed in real device emulation mode (See DEVICE)");
		exec = false;
	}

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			char *tlp = lp;
			char *id;

			if ((id = GetID(lp)) && strlen(id) > 0) {
				if (cmphstr(id, "basic")) {
					headerType = BASIC;
					realtapeMode = true;
				} else if (cmphstr(id, "numbers")) {
					headerType = NUMBERS;
					realtapeMode = true;
				} else if (cmphstr(id, "chars")) {
					headerType = CHARS;
					realtapeMode = true;
				} else if (cmphstr(id, "code")) {
					headerType = CODE;
					realtapeMode = true;
				} else if (cmphstr(id, "headless")) {
					headerType = HEADLESS;
					realtapeMode = true;
				}
			}

			if (realtapeMode) {
				if (anyComma(lp)) {
					if (headerType == HEADLESS) {
						if (!anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							length = val;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0 || val > 255) {
								Error("[SAVETAP] Invalid flag byte", bp, PASS3); return;
							}
							param3 = val;
						}
					} else if (!anyComma(lp)) {
						fnaamh = GetDelimitedString(lp);
						if (fnaamh.empty()) {
							Error("[SAVETAP] Syntax error in tape file name", bp, PASS3);
							return;
						} else if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;

							if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
								if (val < 0) {
									Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
								} else if (val > 0xFFFF) {
									Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
								}
								length = val;

								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param2 = val;
								}
								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param3 = val;
								}
							} else {
								Error("[SAVETAP] Syntax error. Missing block length", bp, PASS3); return;
							}
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
					} else {
						Error("[SAVETAP] Syntax error. Missing tape block file name", bp, PASS3); return;
					}
				} else {
					realtapeMode = false;
				}
			}
			if (!realtapeMode) {
				lp = tlp;
				IsLabelNotFound = false;
				if (!ParseExpression(lp, val) || IsLabelNotFound) {
					Error("[SAVETAP] Syntax error", bp, PASS3); return;
				}
				if (val < 0) {
					Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
				}
				start = val;
			}
		} else {
			Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
		}
	} else if (StartAddress < 0) {
		Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
	} else {
		start = StartAddress;
	}

	if (exec) {
		int done = 0;

		if (realtapeMode) {
			done = TAP_SaveBlock(fnaam, headerType, fnaamh.c_str(), start, length, param2, param3);
		} else {
			if (!IsZXSpectrumDevice(DeviceID)) {
				Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.", Device->ID, SUPPRESS);
			} else {
				done = TAP_SaveSnapshot(fnaam, start);
			}
		}

		if (!done) {
			Error("[SAVETAP] Error writing file", bp, IF_FIRST);
		}
	}
}